

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDiscreteDynamicsWorld.cpp
# Opt level: O0

void __thiscall
InplaceSolverIslandCallback::setup
          (InplaceSolverIslandCallback *this,btContactSolverInfo *solverInfo,
          btTypedConstraint **sortedConstraints,int numConstraints,btIDebugDraw *debugDrawer)

{
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 in_R8;
  btPersistentManifold **fillData;
  int newsize;
  undefined4 in_stack_ffffffffffffffe0;
  
  *(undefined8 *)(in_RDI + 8) = in_RSI;
  *(undefined8 *)(in_RDI + 0x18) = in_RDX;
  *(undefined4 *)(in_RDI + 0x20) = in_ECX;
  *(undefined8 *)(in_RDI + 0x28) = in_R8;
  fillData = (btPersistentManifold **)0x0;
  btAlignedObjectArray<btCollisionObject_*>::resize
            ((btAlignedObjectArray<btCollisionObject_*> *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0)
             ,(int)((ulong)in_R8 >> 0x20),(btCollisionObject **)0x0);
  newsize = (int)((ulong)in_R8 >> 0x20);
  btAlignedObjectArray<btPersistentManifold_*>::resize
            ((btAlignedObjectArray<btPersistentManifold_*> *)
             CONCAT44(in_ECX,in_stack_ffffffffffffffe0),newsize,fillData);
  btAlignedObjectArray<btTypedConstraint_*>::resize
            ((btAlignedObjectArray<btTypedConstraint_*> *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0)
             ,newsize,(btTypedConstraint **)fillData);
  return;
}

Assistant:

SIMD_FORCE_INLINE void setup ( btContactSolverInfo* solverInfo, btTypedConstraint** sortedConstraints,	int	numConstraints,	btIDebugDraw* debugDrawer)
	{
		btAssert(solverInfo);
		m_solverInfo = solverInfo;
		m_sortedConstraints = sortedConstraints;
		m_numConstraints = numConstraints;
		m_debugDrawer = debugDrawer;
		m_bodies.resize (0);
		m_manifolds.resize (0);
		m_constraints.resize (0);
	}